

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<int,_true,_int>::BitpackingWriter::WriteFor
               (int *values,bool *validity,bitpacking_width_t width,int frame_of_reference,
               idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  int *piVar7;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar8;
  ulong uVar9;
  uint32_t *in;
  ulong uVar10;
  uint32_t local_b8 [34];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  uVar6 = iVar5 * width >> 3;
  FlushAndCreateSegmentIfFull((BitpackingCompressionState<int,_true,_int> *)data_ptr,uVar6 + 8,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  lVar3 = *(long *)((long)data_ptr + 0x48);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x5000000;
  piVar7 = *(int **)((long)data_ptr + 0x40);
  *piVar7 = frame_of_reference;
  *(int **)((long)data_ptr + 0x40) = piVar7 + 1;
  piVar7[1] = (uint)width;
  piVar7 = piVar7 + 2;
  *(int **)((long)data_ptr + 0x40) = piVar7;
  uVar8 = count & 0xffffffffffffffe0;
  if (uVar8 != 0) {
    uVar9 = 0;
    uVar10 = 0;
    in = (uint32_t *)values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar9 >> 3) + (long)piVar7),(uint)width);
      uVar10 = uVar10 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar10 < uVar8);
  }
  if ((count & 0x1f) != 0) {
    uVar9 = (ulong)(((uint)count & 0x1f) << 2);
    switchD_01306cb1::default((void *)((long)local_b8 + uVar9),0,0x80 - uVar9);
    switchD_012dd528::default(local_b8,values + uVar8,uVar9);
    duckdb_fastpforlib::fastpack
              (local_b8,(uint32_t *)((long)piVar7 + (width * uVar8 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<int,_true,_int> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}